

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

string_t __thiscall
duckdb::StringVector::AddStringOrBlob(StringVector *this,Vector *vector,string_t data)

{
  VectorStringBuffer *pVVar1;
  string_t sVar2;
  char *data_00;
  
  data_00 = data.value._0_8_;
  if (0xc < (uint)vector) {
    pVVar1 = GetStringBuffer((Vector *)this);
    sVar2 = StringHeap::AddBlob(&pVVar1->heap,data_00,(ulong)vector & 0xffffffff);
    data_00 = sVar2.value._8_8_;
    vector = sVar2.value._0_8_;
  }
  sVar2.value.pointer.ptr = data_00;
  sVar2.value._0_8_ = vector;
  return (string_t)sVar2.value;
}

Assistant:

string_t StringVector::AddStringOrBlob(Vector &vector, string_t data) {
	D_ASSERT(vector.GetType().InternalType() == PhysicalType::VARCHAR);
	if (data.IsInlined()) {
		// string will be inlined: no need to store in string heap
		return data;
	}
	auto &string_buffer = GetStringBuffer(vector);
	return string_buffer.AddBlob(data);
}